

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Float32_To_Int32_Clip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float fVar1;
  float *src;
  int iVar2;
  PaInt32 *dest;
  float fVar3;
  
  if (count != 0) {
    do {
      fVar3 = *sourceBuffer * 2.1474836e+09;
      iVar2 = -0x80000000;
      if (-2.1474836e+09 <= fVar3) {
        fVar1 = 2.1474836e+09;
        if (fVar3 <= 2.1474836e+09) {
          fVar1 = fVar3;
        }
        iVar2 = (int)fVar1;
      }
      count = count - 1;
      *(int *)destinationBuffer = iVar2;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
    } while (count != 0);
  }
  return;
}

Assistant:

static void Float32_To_Int32_Clip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    PaInt32 *dest =  (PaInt32*)destinationBuffer;
    (void) ditherGenerator; /* unused parameter */
    
    while( count-- )
    {
        /* REVIEW */
#ifdef PA_USE_C99_LRINTF
        float scaled = *src * 0x7FFFFFFF;
        PA_CLIP_( scaled, -2147483648.f, 2147483647.f  );
        *dest = lrintf(scaled-0.5f);
#else
        double scaled = *src * 0x7FFFFFFF;
        PA_CLIP_( scaled, -2147483648., 2147483647.  );
        *dest = (PaInt32) scaled;
#endif

        src += sourceStride;
        dest += destinationStride;
    }
}